

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O3

ostream * std::operator<<(ostream *os,vector<unsigned_char,_std::allocator<unsigned_char>_> *buf)

{
  ostream *poVar1;
  byte *pbVar2;
  byte bVar3;
  ostream oVar4;
  uchar *b;
  byte *pbVar5;
  ios state;
  ostream local_139;
  ios local_138 [264];
  
  poVar1 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x1) {
    oVar4 = poVar1[0xe0];
  }
  else {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  std::ios::ios(local_138,(streambuf *)0x0);
  std::ios::copyfmt((ios *)local_138);
  pbVar5 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar2 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar2) {
    bVar3 = 0;
    do {
      std::ios::copyfmt((ios *)(os + *(long *)(*(long *)os + -0x18)));
      if (!(bool)(~bVar3 & 1 | oVar4 == (ostream)0x0)) {
        local_139 = oVar4;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_139,1);
      }
      std::ostream::operator<<((ostream *)os,(uint)*pbVar5);
      pbVar5 = pbVar5 + 1;
      bVar3 = 1;
    } while (pbVar5 != pbVar2);
  }
  std::ios_base::~ios_base((ios_base *)local_138);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream&os, const std::vector<T, A>& buf)
{
    auto fillchar = os.fill();
    std::ios state(NULL);  state.copyfmt(os);

    bool first= true;
    for (const auto& b : buf) {
        os.copyfmt(state);
        if (!first && fillchar) os << fillchar;
        if constexpr (std::is_integral_v<T> && sizeof(T)==1) {
            // This makes sure the numbers in byte and char vectors are printed 
            // as numbers, instead of as characters.
            os << +b;
        }
        else {
            os << b;
        }
        first= false;
    }
    return os;
}